

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O2

int run_test_tcp_local_connect_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = is_supported_system();
  if (iVar1 == 0) {
    pcVar3 = "Unsupported system";
LAB_0018893f:
    fprintf(_stderr,"%s\n",pcVar3);
    fflush(_stderr);
    return 7;
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&timer);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_tcp_init(uVar2,&conn);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_tcp_connect(&connect_req,&conn,&addr,connect_local_cb);
          if (iVar1 == -0x65) {
            pcVar3 = "Network unreachable.";
            goto LAB_0018893f;
          }
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              eval_a = 0;
              uVar2 = uv_default_loop();
              iVar1 = uv_loop_close(uVar2);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "uv_loop_close(uv_default_loop())";
              pcVar3 = "0";
              uVar2 = 0x9c;
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x9a;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar2 = 0x97;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x8f;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x8c;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x88;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0x85;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_local_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  if (!is_supported_system()) {
    RETURN_SKIP("Unsupported system");
  }
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* Give it 1s to timeout. */
  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_local_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}